

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Glucose::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int> *map,Var *max)

{
  bool bVar1;
  uint uVar2;
  Var VVar3;
  Lit *pLVar4;
  uchar *tbs;
  Clause *in_RDX;
  size_t *siglen;
  FILE *in_RSI;
  uchar *sig;
  Solver *in_R8;
  int i;
  lbool *in_stack_ffffffffffffff98;
  FILE *in_stack_ffffffffffffffa0;
  Solver *in_stack_ffffffffffffffa8;
  Lit in_stack_ffffffffffffffb0;
  lbool local_35;
  int local_34;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint x;
  uint i_00;
  
  bVar1 = satisfied(in_R8,(Clause *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (!bVar1) {
    x = 0;
    while( true ) {
      i_00 = x;
      uVar2 = Clause::size(in_RDX);
      tbs = (uchar *)(ulong)uVar2;
      if ((int)uVar2 <= (int)x) break;
      pLVar4 = Clause::operator[](in_RDX,i_00);
      local_34 = pLVar4->x;
      value(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
      lbool::lbool(&local_35,'\x01');
      bVar1 = lbool::operator!=(in_stack_ffffffffffffff98,
                                (lbool)(uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
      if (bVar1) {
        sig = (uchar *)(ulong)i_00;
        in_stack_ffffffffffffffa0 = in_RSI;
        pLVar4 = Clause::operator[](in_RDX,i_00);
        uVar2 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar4->x,sig,siglen,tbs,(size_t)in_R8);
        in_stack_ffffffffffffffa8 = (Solver *)0x13705e;
        if ((uVar2 & 1) != 0) {
          in_stack_ffffffffffffffa8 = (Solver *)0x138d44;
        }
        pLVar4 = Clause::operator[](in_RDX,i_00);
        var((Lit)pLVar4->x);
        VVar3 = mapVar(x,(vec<int> *)in_stack_ffffffffffffffa8,&in_stack_ffffffffffffffa0->_flags);
        fprintf(in_stack_ffffffffffffffa0,"%s%d ",in_stack_ffffffffffffffa8,(ulong)(VVar3 + 1));
      }
      x = i_00 + 1;
    }
    fprintf(in_RSI,"0\n");
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, Clause &c, vec <Var> &map, Var &max) {
    if(satisfied(c)) return;

    for(int i = 0; i < c.size(); i++)
        if(value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max) + 1);
    fprintf(f, "0\n");
}